

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_suite::test_ctor(void)

{
  undefined8 local_98;
  value_type local_90 [2];
  undefined1 local_80 [8];
  moment<double> mover;
  value_type local_60 [2];
  undefined1 local_50 [8];
  moment<double> copy;
  value_type local_30 [2];
  undefined1 local_20 [8];
  moment<double> filter;
  
  trial::online::decay::basic_moment<double,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_(trial::online::with)1> *)local_20,0.125);
  local_30[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_20);
  copy.sum.mean = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x1e,"void mean_double_suite::test_ctor()",local_30,&copy.sum);
  local_50 = local_20;
  copy.mean_factor = filter.mean_factor;
  copy.normalization = filter.normalization;
  local_60[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_50);
  mover.sum.mean = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("copy.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x22,"void mean_double_suite::test_ctor()",local_60,&mover.sum);
  local_80 = local_50;
  mover.mean_factor = copy.mean_factor;
  mover.normalization = copy.normalization;
  local_90[0] = trial::online::decay::basic_moment<double,_(trial::online::with)1>::mean
                          ((basic_moment<double,_(trial::online::with)1> *)local_80);
  local_98 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("mover.mean()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/decay/moment_suite.cpp"
             ,0x26,"void mean_double_suite::test_ctor()",local_90,&local_98);
  return;
}

Assistant:

void test_ctor()
{
    decay::moment<double> filter(one_over_eight);
    TRIAL_TEST_EQ(filter.mean(), 0.0);

    // Copy constructor
    decay::moment<double> copy(filter);
    TRIAL_TEST_EQ(copy.mean(), 0.0);

    // Move constructor
    decay::moment<double> mover(std::move(copy));
    TRIAL_TEST_EQ(mover.mean(), 0.0);
}